

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

idx_t duckdb::TemplatedMatch<true,float,duckdb::DistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  bool bVar2;
  const_reference pvVar3;
  idx_t iVar4;
  SelectionVector *pSVar5;
  sel_t *psVar6;
  idx_t iVar7;
  idx_t match_count;
  idx_t iVar8;
  idx_t i;
  idx_t iVar9;
  idx_t i_1;
  float local_90;
  uint local_8c;
  data_ptr_t local_88;
  value_type local_80;
  ulong local_78;
  data_ptr_t local_70;
  SelectionVector *local_68;
  idx_t local_60;
  ValidityBytes rhs_mask;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  local_68 = (lhs_format->unified).sel;
  local_88 = (lhs_format->unified).data;
  local_70 = rhs_row_locations->data;
  local_60 = count;
  pvVar3 = vector<unsigned_long,_true>::get<true>(&rhs_layout->offsets,col_idx);
  local_78 = col_idx >> 3;
  local_8c = 1 << ((byte)col_idx & 7);
  local_80 = *pvVar3;
  if (puVar1 == (unsigned_long *)0x0) {
    iVar8 = 0;
    for (iVar9 = 0; local_60 != iVar9; iVar9 = iVar9 + 1) {
      psVar6 = sel->sel_vector;
      iVar7 = iVar9;
      if (psVar6 != (sel_t *)0x0) {
        iVar7 = (idx_t)psVar6[iVar9];
      }
      iVar4 = iVar7;
      if (local_68->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)local_68->sel_vector[iVar7];
      }
      rhs_mask.validity_mask = *(uchar **)(local_70 + iVar7 * 8);
      rhs_mask.capacity =
           ((long)(rhs_layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(rhs_layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_90 = *(float *)(rhs_mask.validity_mask + local_80);
      if ((local_8c & rhs_mask.validity_mask[local_78]) == 0) {
LAB_008f0663:
        psVar6[iVar8] = (sel_t)iVar7;
        iVar8 = iVar8 + 1;
      }
      else {
        bVar2 = NotEquals::Operation<float>((float *)(local_88 + iVar4 * 4),&local_90);
        if (bVar2) {
          psVar6 = sel->sel_vector;
          goto LAB_008f0663;
        }
        iVar4 = *no_match_count;
        *no_match_count = iVar4 + 1;
        no_match_sel->sel_vector[iVar4] = (sel_t)iVar7;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rhs_mask.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
  }
  else {
    iVar8 = 0;
    for (iVar9 = 0; local_60 != iVar9; iVar9 = iVar9 + 1) {
      iVar7 = iVar9;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar7 = (idx_t)sel->sel_vector[iVar9];
      }
      iVar4 = iVar7;
      if (local_68->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)local_68->sel_vector[iVar7];
      }
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>,
                         iVar4);
      rhs_mask.validity_mask = *(uchar **)(local_70 + iVar7 * 8);
      rhs_mask.capacity =
           ((long)(rhs_layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(rhs_layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_90 = *(float *)(rhs_mask.validity_mask + local_80);
      bVar2 = DistinctFrom::Operation<float>
                        ((float *)(local_88 + iVar4 * 4),&local_90,!bVar2,
                         (local_8c & rhs_mask.validity_mask[local_78]) == 0);
      if (bVar2) {
        iVar4 = iVar8;
        pSVar5 = sel;
        iVar8 = iVar8 + 1;
      }
      else {
        iVar4 = *no_match_count;
        *no_match_count = iVar4 + 1;
        pSVar5 = no_match_sel;
      }
      pSVar5->sel_vector[iVar4] = (sel_t)iVar7;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rhs_mask.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
  }
  return iVar8;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}